

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O0

sub_idx_t lf::refinement::MeshHierarchy::LongestEdge(Entity *T)

{
  double dVar1;
  sub_idx_t sVar2;
  int iVar3;
  runtime_error *this;
  undefined4 extraout_var;
  Scalar *pSVar4;
  reference ppEVar5;
  undefined4 extraout_var_00;
  Scalar *pSVar6;
  Matrix<double,__1,_1,_0,__1,_1> local_280;
  double local_270;
  double approx_length;
  int local_260;
  int k;
  undefined1 local_258 [8];
  MatrixXd mp_refc;
  double dStack_238;
  sub_idx_t idx_longest_edge;
  double max_len;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> sub_edges;
  undefined1 local_218 [4];
  size_type num_edges;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  Entity *local_10;
  Entity *T_local;
  
  local_10 = T;
  iVar3 = (**T->_vptr_Entity)();
  if (iVar3 != 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(local_188,"Entity must be a call");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"T.Codim() == 0",&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_1f1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1c8,&local_1f0,0x730,(string *)local_218);
    std::__cxx11::string::~string((string *)local_218);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"this code should not be reached");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = (*local_10->_vptr_Entity[4])();
  sub_edges._M_extent._M_extent_value._3_1_ = (undefined1)iVar3;
  sub_edges._M_extent._M_extent_value._4_4_ =
       lf::base::RefEl::NumSubEntities((RefEl *)((long)&sub_edges._M_extent._M_extent_value + 3),1);
  iVar3 = (*local_10->_vptr_Entity[1])(local_10,1);
  max_len = (double)CONCAT44(extraout_var,iVar3);
  dStack_238 = 0.0;
  mp_refc.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ =
       0;
  k = 1;
  local_260 = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_258,&k,&local_260);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_258,0,0)
  ;
  *pSVar4 = 0.5;
  for (approx_length._4_4_ = 0;
      sVar2 = mp_refc.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols._4_4_, approx_length._4_4_ < sub_edges._M_extent._M_extent_value._4_4_;
      approx_length._4_4_ = approx_length._4_4_ + 1) {
    ppEVar5 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                        ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&max_len,
                         (long)(int)approx_length._4_4_);
    iVar3 = (*(*ppEVar5)->_vptr_Entity[3])();
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x30))
              (&local_280,(long *)CONCAT44(extraout_var_00,iVar3),local_258);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_280,0);
    dVar1 = *pSVar6;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_280);
    if (dStack_238 < dVar1) {
      mp_refc.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
      _4_4_ = approx_length._4_4_;
      dStack_238 = dVar1;
    }
    local_270 = dVar1;
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_258);
  return sVar2;
}

Assistant:

sub_idx_t MeshHierarchy::LongestEdge(const lf::mesh::Entity &T) {
  LF_VERIFY_MSG(T.Codim() == 0, "Entity must be a call");
  // Obtain iterator over the edges
  const size_type num_edges = T.RefEl().NumSubEntities(1);
  auto sub_edges = T.SubEntities(1);
  double max_len = 0.0;
  sub_idx_t idx_longest_edge = 0;
  Eigen::MatrixXd mp_refc(1, 1);
  mp_refc(0, 0) = 0.5;
  for (int k = 0; k < num_edges; k++) {
    // Approximate length by "1-point quadrature"
    const double approx_length =
        (sub_edges[k]->Geometry()->IntegrationElement(mp_refc))[0];
    if (max_len < approx_length) {
      idx_longest_edge = k;
      max_len = approx_length;
    }
  }
  return idx_longest_edge;
}